

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

string * __thiscall Tracker::logSamples_abi_cxx11_(string *__return_storage_ptr__,Tracker *this)

{
  pointer pbVar1;
  long lVar2;
  ulong uVar3;
  string sStack_48;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&sStack_48);
  lVar2 = 0;
  for (uVar3 = 0;
      pbVar1 = (this->m_tracks).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_tracks).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar3 = uVar3 + 1) {
    logSamples(&sStack_48,this,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    lVar2 = lVar2 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logSamples() {
    std::string log = "";

    for (size_t t = 0; t < m_tracks.size(); t++)
        log += logSamples(m_tracks[t]);

    return log;
}